

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3unas.cpp
# Opt level: O3

void CTcT3Unasm::disasm_instr(CTcUnasSrc *src,CTcUnasOut *out,char ch_op)

{
  ushort uVar1;
  undefined2 uVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar6;
  undefined4 extraout_var_07;
  long lVar7;
  undefined4 uVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  char *pcVar14;
  uint uVar15;
  uint uVar16;
  char *pcVar17;
  long lVar18;
  char ch [10];
  char name [128];
  byte local_d4;
  undefined1 uStack_d3;
  undefined1 uStack_d2;
  undefined1 uStack_d1;
  undefined1 local_d0;
  undefined2 local_cf;
  CTcUnasOut *local_c8;
  uint local_c0;
  uint local_bc;
  char local_b8 [136];
  undefined4 extraout_var_06;
  
  (*src->_vptr_CTcUnasSrc[3])();
  uVar11 = (ulong)(byte)ch_op;
  iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
  (**(code **)(*(long *)out + 0x10))
            (out,"%8lx  %-14.14s ",CONCAT44(extraout_var,iVar4) + -1,instr_info[uVar11].nm);
  iVar4 = (int)CONCAT71(in_register_00000011,ch_op);
  local_c8 = out;
  if (iVar4 == -0x70) {
    (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
    (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
    uVar1 = CONCAT11(uStack_d3,local_d4);
    uVar15 = (uint)uVar1;
    (**(code **)(*(long *)out + 0x10))(out,"0x%x\n",uVar15);
    if (uVar1 != 0) {
      do {
        iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
        (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
        (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
        (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d2);
        (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d1);
        (*src->_vptr_CTcUnasSrc[2])(src,&local_d0);
        (*src->_vptr_CTcUnasSrc[2])(src,&local_cf);
        (*src->_vptr_CTcUnasSrc[2])(src,(long)&local_cf + 1);
        iVar5 = (*src->_vptr_CTcUnasSrc[3])(src);
        if (CONCAT44(extraout_var_01,iVar5) == CONCAT44(extraout_var_00,iVar4)) break;
        pcVar17 = "nil";
        pcVar14 = "";
        switch(local_d4) {
        case 1:
          break;
        case 2:
          pcVar17 = "true";
          pcVar14 = "";
          break;
        default:
          pcVar14 = "???";
          pcVar17 = "???";
          break;
        case 5:
          pcVar14 = local_b8;
          sprintf(pcVar14,"0x%08lx",
                  (ulong)CONCAT13(local_d0,CONCAT12(uStack_d1,CONCAT11(uStack_d2,uStack_d3))));
          pcVar17 = "object";
          break;
        case 6:
          pcVar14 = local_b8;
          sprintf(pcVar14,"0x%04x",(ulong)CONCAT11(uStack_d2,uStack_d3));
          pcVar17 = "prop";
          break;
        case 7:
          pcVar14 = local_b8;
          sprintf(pcVar14,"0x%08lx",
                  (ulong)CONCAT13(local_d0,CONCAT12(uStack_d1,CONCAT11(uStack_d2,uStack_d3))));
          pcVar17 = "int";
          break;
        case 8:
          pcVar14 = local_b8;
          sprintf(pcVar14,"0x%08lx",
                  (ulong)CONCAT13(local_d0,CONCAT12(uStack_d1,CONCAT11(uStack_d2,uStack_d3))));
          pcVar17 = "sstring";
          break;
        case 10:
          pcVar14 = local_b8;
          sprintf(pcVar14,"0x%08lx",
                  (ulong)CONCAT13(local_d0,CONCAT12(uStack_d1,CONCAT11(uStack_d2,uStack_d3))));
          pcVar17 = "list";
          break;
        case 0xc:
          pcVar14 = local_b8;
          sprintf(pcVar14,"0x%08lx",
                  (ulong)CONCAT13(local_d0,CONCAT12(uStack_d1,CONCAT11(uStack_d2,uStack_d3))));
          pcVar17 = "funcptr";
          break;
        case 0xf:
          pcVar14 = local_b8;
          sprintf(pcVar14,"0x%08lx",
                  (ulong)CONCAT13(local_d0,CONCAT12(uStack_d1,CONCAT11(uStack_d2,uStack_d3))));
          pcVar17 = "enum";
        }
        iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
        sVar3 = local_cf;
        iVar5 = (*src->_vptr_CTcUnasSrc[3])(src);
        (**(code **)(*(long *)local_c8 + 0x10))
                  (local_c8,"          0x%08lx      %-8.8s(%-10.10s) -> +0x%04lx (0x%08lx)\n",
                   CONCAT44(extraout_var_02,iVar4) + -7,pcVar17,pcVar14,sVar3,
                   CONCAT44(extraout_var_03,iVar5) + (long)local_cf + -2);
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
    }
    (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
    (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
    iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
    uVar2 = CONCAT11(uStack_d3,local_d4);
    iVar5 = (*src->_vptr_CTcUnasSrc[3])(src);
    (**(code **)(*(long *)local_c8 + 0x10))
              (local_c8,"          0x%08lx      default              -> +0x%04lx (0x%08lx)\n",
               CONCAT44(extraout_var_04,iVar4) + -2,uVar2,
               CONCAT44(extraout_var_05,iVar5) + (long)CONCAT11(uStack_d3,local_d4) + -2);
  }
  else {
    if (iVar4 == 0x57) {
      (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
      (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
      (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d2);
      (**(code **)(*(long *)out + 0x10))
                (out,"len=0x%x, cnt=0x%x [",CONCAT11(uStack_d3,local_d4),local_d4);
      local_c0 = (uint)local_d4;
      if (local_c0 != 0) {
        uVar15 = 0;
        do {
          (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
          (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
          uVar1 = CONCAT11(uStack_d3,local_d4);
          uVar10 = 0x80;
          if (uVar1 < 0x80) {
            uVar10 = (uint)uVar1;
          }
          uVar16 = (uint)uVar1;
          if (uVar16 == 0) {
            uVar13 = 0;
          }
          else {
            uVar11 = (ulong)uVar10;
            pcVar14 = local_b8;
            local_bc = uVar10;
            do {
              (*src->_vptr_CTcUnasSrc[2])(src,pcVar14);
              pcVar14 = pcVar14 + 1;
              uVar11 = uVar11 - 1;
              uVar10 = local_bc;
              uVar13 = local_bc;
            } while (uVar11 != 0);
          }
          pcVar14 = ", ";
          if (uVar15 == 0) {
            pcVar14 = ":";
          }
          (**(code **)(*(long *)local_c8 + 0x10))(local_c8,"%s%.*s",pcVar14,uVar13,local_b8);
          if (uVar13 < uVar16) {
            iVar4 = uVar16 - uVar10;
            do {
              (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != local_c0);
      }
      lVar18 = *(long *)local_c8;
      pcVar14 = "]";
      out = local_c8;
    }
    else {
      if (0 < instr_info[uVar11].op_cnt) {
        lVar18 = 0;
        do {
          if (lVar18 != 0) {
            (**(code **)(*(long *)out + 0x10))(out,", ");
          }
          switch(*(undefined4 *)(uVar11 * 0x18 + 0x37b0dc + lVar18 * 4)) {
          case 0:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
            uVar15 = (uint)(char)local_d4;
            goto LAB_0024a61d;
          case 1:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
            uVar15 = (uint)local_d4;
            goto LAB_0024a61d;
          case 2:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
            uVar15 = (uint)CONCAT11(uStack_d3,local_d4);
            goto LAB_0024a61d;
          case 3:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
            uVar15 = (uint)CONCAT11(uStack_d3,local_d4);
LAB_0024a61d:
            lVar7 = *(long *)out;
            pcVar14 = "0x%x";
LAB_0024a62b:
            (**(code **)(lVar7 + 0x10))(out,pcVar14,uVar15);
            goto LAB_0024a758;
          case 4:
          case 5:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d2);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d1);
            uVar8 = CONCAT13(uStack_d1,CONCAT12(uStack_d2,CONCAT11(uStack_d3,local_d4)));
            lVar7 = *(long *)out;
            pcVar14 = "0x%lx";
            break;
          case 6:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d2);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d1);
            uVar8 = CONCAT13(uStack_d1,CONCAT12(uStack_d2,CONCAT11(uStack_d3,local_d4)));
            lVar7 = *(long *)out;
            pcVar14 = "string(0x%lx)";
            break;
          case 7:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d2);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d1);
            uVar8 = CONCAT13(uStack_d1,CONCAT12(uStack_d2,CONCAT11(uStack_d3,local_d4)));
            lVar7 = *(long *)out;
            pcVar14 = "list(0x%lx)";
            break;
          case 8:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d2);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d1);
            uVar8 = CONCAT13(uStack_d1,CONCAT12(uStack_d2,CONCAT11(uStack_d3,local_d4)));
            lVar7 = *(long *)out;
            pcVar14 = "code(0x%08lx)";
            break;
          case 9:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
            sVar3 = CONCAT11(uStack_d3,local_d4);
            uVar12 = (ulong)sVar3;
            if ((long)uVar12 < 0) {
              iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
              lVar6 = CONCAT44(extraout_var_07,iVar4);
              lVar7 = *(long *)local_c8;
              pcVar14 = "-0x%04x (0x%08lx)";
              uVar9 = (ulong)(uint)-(int)sVar3;
            }
            else {
              iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
              lVar6 = CONCAT44(extraout_var_06,iVar4);
              lVar7 = *(long *)local_c8;
              pcVar14 = "+0x%04x (0x%08lx)";
              uVar9 = uVar12 & 0xffffffff;
            }
            out = local_c8;
            (**(code **)(lVar7 + 0x10))(local_c8,pcVar14,uVar9,lVar6 + uVar12 + -2);
            goto LAB_0024a758;
          case 10:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d2);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d1);
            uVar8 = CONCAT13(uStack_d1,CONCAT12(uStack_d2,CONCAT11(uStack_d3,local_d4)));
            lVar7 = *(long *)out;
            pcVar14 = "object(0x%lx)";
            break;
          case 0xb:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
            uVar15 = (uint)CONCAT11(uStack_d3,local_d4);
            lVar7 = *(long *)out;
            pcVar14 = "property(0x%x)";
            goto LAB_0024a62b;
          case 0xc:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d2);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d1);
            uVar8 = CONCAT13(uStack_d1,CONCAT12(uStack_d2,CONCAT11(uStack_d3,local_d4)));
            lVar7 = *(long *)out;
            pcVar14 = "enum(0x%lx)";
            break;
          case 0xd:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
            if (local_d4 == 3) {
              lVar7 = *(long *)out;
              pcVar14 = "definingobj";
            }
            else if (local_d4 == 2) {
              lVar7 = *(long *)out;
              pcVar14 = "targetobj";
            }
            else {
              if (local_d4 != 1) {
                uVar15 = (uint)(char)local_d4;
                goto LAB_0024a61d;
              }
              lVar7 = *(long *)out;
              pcVar14 = "targetprop";
            }
            goto LAB_0024a581;
          case 0xe:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
            (**(code **)(*(long *)out + 0x10))(out,"string(inline)");
            for (uVar12 = (ulong)CONCAT11(uStack_d3,local_d4); uVar12 != 0; uVar12 = uVar12 - 1) {
              (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
            }
            goto LAB_0024a758;
          default:
            lVar7 = *(long *)out;
            pcVar14 = "...unknown type...";
LAB_0024a581:
            (**(code **)(lVar7 + 0x10))(out,pcVar14);
            goto LAB_0024a758;
          }
          (**(code **)(lVar7 + 0x10))(out,pcVar14,uVar8);
LAB_0024a758:
          lVar18 = lVar18 + 1;
        } while (lVar18 < instr_info[uVar11].op_cnt);
      }
      lVar18 = *(long *)out;
      pcVar14 = "\n";
    }
    (**(code **)(lVar18 + 0x10))(out,pcVar14);
  }
  return;
}

Assistant:

void CTcT3Unasm::disasm_instr(CTcUnasSrc *src, CTcUnasOut *out, char ch_op)
{
    t3_instr_info_t *info;
    int i;
    ulong acc;
    char ch[10];
    ulong prv_ofs = src->get_ofs();
    
    /* get the information on this instruction */
    info = &instr_info[(int)(uchar)ch_op];
    out->print("%8lx  %-14.14s ", src->get_ofs() - 1, info->nm);

    /* check the instruction type */
    switch((uchar)ch_op)
    {
    case OPC_SWITCH:
        /* 
         *   It's a switch instruction - special handling is required,
         *   since this instruction doesn't fit any of the normal
         *   patterns.  First, get the number of elements in the case
         *   table - this is a UINT2 value at the start of the table.  
         */
        src->next_byte(ch);
        src->next_byte(ch+1);
        acc = osrp2(ch);

        /* display the count */
        out->print("0x%x\n", (uint)acc);

        /* display the table */
        for (i = 0 ; i < (int)acc ; ++i)
        {
            const char *dt;
            char valbuf[128];
            const char *val = valbuf;

            /* note the current offset */
            prv_ofs = src->get_ofs();
            
            /* read the DATAHOLDER value */
            src->next_byte(ch);
            src->next_byte(ch+1);
            src->next_byte(ch+2);
            src->next_byte(ch+3);
            src->next_byte(ch+4);

            /* read the jump offset */
            src->next_byte(ch+5);
            src->next_byte(ch+6);

            /* 
             *   stop looping if the offset hasn't changed - this probably
             *   means we're stuck trying to interpret as a "switch" some
             *   data at the end of the stream that happens to look like a
             *   switch but really isn't (such as an exception table, or
             *   debug records) 
             */
            if (src->get_ofs() == prv_ofs)
                break;

            /* show the value */
            switch(ch[0])
            {
            case VM_NIL:
                dt = "nil";
                val = "";
                break;
                
            case VM_TRUE:
                dt = "true";
                val = "";
                break;
                
            case VM_OBJ:
                dt = "object";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;
                
            case VM_PROP:
                dt = "prop";
                sprintf(valbuf, "0x%04x", osrp2(ch+1));
                break;
                
            case VM_INT:
                dt = "int";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;

            case VM_ENUM:
                dt = "enum";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;
                
            case VM_SSTRING:
                dt = "sstring";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;
                
            case VM_LIST:
                dt = "list";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;
                
            case VM_FUNCPTR:
                dt = "funcptr";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;

            default:
                dt = "???";
                val = "???";
                break;
            }

            /* show the slot data */
            out->print("          0x%08lx      %-8.8s(%-10.10s) "
                       "-> +0x%04lx (0x%08lx)\n",
                       src->get_ofs() - 7, dt, val, osrp2(ch+5),
                       src->get_ofs() - 2 + osrp2s(ch+5));
        }

        /* read and show the 'default' jump offset */
        src->next_byte(ch);
        src->next_byte(ch+1);
        out->print("          0x%08lx      default              "
                   "-> +0x%04lx (0x%08lx)\n",
                   src->get_ofs() - 2, osrp2(ch),
                   src->get_ofs() - 2 + osrp2s(ch));

        /* done */
        break;

    case OPC_NAMEDARGTAB:
        /* named argument table */
        src->next_byte(ch);
        src->next_byte(ch+1);
        src->next_byte(ch+2);
        acc = osrp2(ch);
        out->print("len=0x%x, cnt=0x%x [", (uint)acc, (uint)(uchar)*ch);
        acc = (uchar)*ch;

        /* show the names */
        for (i = 0 ; i < (int)acc ; ++i)
        {
            /* get the length */
            src->next_byte(ch);
            src->next_byte(ch);
            uint len = osrp2(ch);

            /* get the name */
            char name[128];
            uint j;
            for (j = 0 ; j < len && j < sizeof(name) ; ++j)
                src->next_byte(name + j);

            /* show the name */
            out->print("%s%.*s", i > 0 ? ", " : ":", (int)j, name);

            /* skip any excess portion of the name */
            for ( ; j < len ; ++j)
                src->next_byte(ch);
        }

        /* end the list, and we're done */
        out->print("]");
        break;

    default:
        /* show all parameters */
        for (i = 0 ; i < info->op_cnt ; ++i)
        {
            /* add a separator if this isn't the first one */
            if (i != 0)
                out->print(", ");
            
            /* display the operand */
            switch(info->op_type[i])
            {
            case T3OP_TYPE_8S:
                /* 8-bit signed integer */
                src->next_byte(ch);
                out->print("0x%x", (int)ch[0]);
                break;

            case T3OP_TYPE_8U:
                /* 8-bit unsigned integer */
                src->next_byte(ch);
                out->print("0x%x", (uint)(uchar)ch[0]);
                break;

            case T3OP_TYPE_16S:
                /* 16-bit signed integer */
                src->next_byte(ch);
                src->next_byte(ch+1);
                acc = osrp2s(ch);
                out->print("0x%x", (int)acc);
                break;

            case T3OP_TYPE_16U:
                /* 16-bit unsigned integer */
                src->next_byte(ch);
                src->next_byte(ch+1);
                acc = osrp2(ch);
                out->print("0x%x", (uint)acc);
                break;

            case T3OP_TYPE_32S:
                /* 32-bit signed integer */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("0x%lx", acc);
                break;

            case T3OP_TYPE_32U:
                /* 32-bit unsigned integer */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("0x%lx", acc);
                break;

            case T3OP_TYPE_STR:
                /* string offset */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("string(0x%lx)", acc);
                break;

            case T3OP_TYPE_LIST:
                /* list offset */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("list(0x%lx)", acc);
                break;

            case T3OP_TYPE_CODE_ABS:
                /* 32-bit absolute code address */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("code(0x%08lx)", acc);
                break;

            case T3OP_TYPE_CODE_REL:
                /* 16-bit relative code address */
                src->next_byte(ch);
                src->next_byte(ch+1);
                acc = osrp2s(ch);
                if ((long)acc < 0)
                    out->print("-0x%04x (0x%08lx)",
                               -(int)acc, src->get_ofs() - 2 + acc);
                else
                    out->print("+0x%04x (0x%08lx)",
                               (int)acc, src->get_ofs() - 2 + acc);
                break;

            case T3OP_TYPE_OBJ:
                /* object ID */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("object(0x%lx)", acc);
                break;

            case T3OP_TYPE_PROP:
                /* property ID */
                src->next_byte(ch);
                src->next_byte(ch+1);
                acc = osrp2(ch);
                out->print("property(0x%x)", (uint)acc);
                break;

            case T3OP_TYPE_ENUM:
                /* enum */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("enum(0x%lx)", acc);
                break;

            case T3OP_TYPE_CTX_ELE:
                /* context element identifier */
                src->next_byte(ch);
                switch(ch[0])
                {
                case PUSHCTXELE_TARGPROP:
                    out->print("targetprop");
                    break;

                case PUSHCTXELE_TARGOBJ:
                    out->print("targetobj");
                    break;

                case PUSHCTXELE_DEFOBJ:
                    out->print("definingobj");
                    break;

                default:
                    out->print("0x%x", (int)ch[0]);
                    break;
                }
                break;

            case T3OP_TYPE_INLINE_STR:
                /* get the string length */
                src->next_byte(ch);
                src->next_byte(ch+1);

                /* show it */
                out->print("string(inline)");

                /* skip the string */
                for (acc = osrp2(ch) ; acc != 0 ; --acc)
                    src->next_byte(ch);

                /* done */
                break;

            default:
                out->print("...unknown type...");
                break;
            }
        }

        /* end the line */
        out->print("\n");
    }
}